

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scl.c
# Opt level: O3

int Scl_CommandBuffer(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Abc_Ntk_t *pAVar5;
  char *pcVar6;
  char *pcVar7;
  float fVar8;
  SC_BusPars Pars;
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  SC_BusPars local_5c;
  Abc_Ntk_t *local_38;
  
  local_38 = Abc_FrameReadNtk(pAbc);
  local_5c.fBufPis = 0;
  local_5c.fUseWireLoads = 0;
  local_5c.fVerbose = 0;
  local_5c.fVeryVerbose = 0;
  if ((SC_Lib *)pAbc->pLibScl == (SC_Lib *)0x0) {
    local_88 = 100;
  }
  else {
    fVar8 = Abc_SclComputeAverageSlew((SC_Lib *)pAbc->pLibScl);
    local_88 = (uint)fVar8;
  }
  local_78 = 0;
  Extra_UtilGetoptReset();
  local_80 = 1;
  local_6c = 10;
  uVar3 = 300;
  local_7c = 0;
  local_84 = 0;
  local_74 = 0;
  local_70 = 0;
  do {
    while( true ) {
      while (iVar1 = Extra_UtilGetopt(argc,argv,"GSNsbpcvwh"), pAVar5 = local_38,
            iVar4 = globalUtilOptind, 0x61 < iVar1) {
        switch(iVar1) {
        case 0x70:
          local_7c = local_7c ^ 1;
          break;
        case 0x71:
        case 0x72:
        case 0x74:
        case 0x75:
          goto switchD_00450fc4_caseD_71;
        case 0x73:
          local_78 = local_78 ^ 1;
          break;
        case 0x76:
          local_74 = local_74 ^ 1;
          break;
        case 0x77:
          local_70 = local_70 ^ 1;
          break;
        default:
          if (iVar1 == 0x62) {
            local_80 = local_80 ^ 1;
          }
          else {
            if (iVar1 != 99) goto switchD_00450fc4_caseD_71;
            local_84 = local_84 ^ 1;
          }
        }
      }
      if (iVar1 < 0x4e) break;
      if (iVar1 == 0x4e) {
        if (argc <= globalUtilOptind) {
          pcVar6 = "Command line switch \"-N\" should be followed by a positive integer.\n";
          goto LAB_00451186;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_6c = uVar2;
      }
      else {
        if (iVar1 != 0x53) goto switchD_00450fc4_caseD_71;
        if (argc <= globalUtilOptind) {
          pcVar6 = "Command line switch \"-S\" should be followed by a positive integer.\n";
LAB_00451186:
          Abc_Print(-1,pcVar6);
          goto switchD_00450fc4_caseD_71;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_88 = uVar2;
      }
      globalUtilOptind = iVar4 + 1;
      if ((int)uVar2 < 0) goto switchD_00450fc4_caseD_71;
    }
    if (iVar1 != 0x47) {
      if (iVar1 == -1) {
        local_5c.fVeryVerbose = local_70;
        local_5c.fVerbose = local_74;
        local_5c.fUseWireLoads = local_84;
        local_5c.fBufPis = local_7c;
        local_5c.fAddBufs = local_80;
        local_5c.fSizeOnly = local_78;
        local_5c.nDegree = local_6c;
        local_5c.Slew = local_88;
        local_5c.GainRatio = uVar3;
        if (local_38 == (Abc_Ntk_t *)0x0) {
          pcVar6 = "Empty network.\n";
        }
        else if (local_38->ntkType == ABC_NTK_LOGIC) {
          if ((local_78 == 0 && local_80 == 0) && (local_38->vPhases == (Vec_Int_t *)0x0)) {
            pcVar6 = "Fanin phase information is not avaiable.\n";
          }
          else if ((pAbc->pLibScl == (void *)0x0) ||
                  (iVar4 = Abc_SclHasDelayInfo(pAbc->pLibScl), iVar4 == 0)) {
            pcVar6 = "Library delay info is not available.\n";
          }
          else {
            pAVar5 = Abc_SclBufferingPerform(pAVar5,(SC_Lib *)pAbc->pLibScl,&local_5c);
            if (pAVar5 != (Abc_Ntk_t *)0x0) {
              Abc_FrameReplaceCurrentNetwork(pAbc,pAVar5);
              return 0;
            }
            pcVar6 = "The command has failed.\n";
          }
        }
        else {
          pcVar6 = "This command can only be applied to a logic network.\n";
        }
        Abc_Print(-1,pcVar6);
        return 1;
      }
      break;
    }
    if (argc <= globalUtilOptind) {
      pcVar6 = "Command line switch \"-G\" should be followed by a positive integer.\n";
      goto LAB_00451186;
    }
    uVar3 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar4 + 1;
  } while (-1 < (int)uVar3);
switchD_00450fc4_caseD_71:
  fwrite("usage: buffer [-GSN num] [-sbpcvwh]\n",0x24,1,(FILE *)pAbc->Err);
  fwrite("\t           performs buffering and sizing and mapped network\n",0x3d,1,(FILE *)pAbc->Err)
  ;
  fprintf((FILE *)pAbc->Err,"\t-G <num> : target gain percentage [default = %d]\n",(ulong)uVar3);
  fprintf((FILE *)pAbc->Err,"\t-S <num> : target slew in pisoseconds [default = %d]\n",
          (ulong)local_88);
  fprintf((FILE *)pAbc->Err,"\t-N <num> : the maximum fanout count [default = %d]\n",(ulong)local_6c
         );
  pcVar7 = "yes";
  pcVar6 = "yes";
  if (local_78 == 0) {
    pcVar6 = "no";
  }
  fprintf((FILE *)pAbc->Err,"\t-s       : toggle performing only sizing [default = %s]\n",pcVar6);
  pcVar6 = "yes";
  if (local_80 == 0) {
    pcVar6 = "no";
  }
  fprintf((FILE *)pAbc->Err,
          "\t-b       : toggle using buffers instead of inverters [default = %s]\n",pcVar6);
  pcVar6 = "yes";
  if (local_7c == 0) {
    pcVar6 = "no";
  }
  fprintf((FILE *)pAbc->Err,"\t-p       : toggle buffering primary inputs [default = %s]\n",pcVar6);
  pcVar6 = "yes";
  if (local_84 == 0) {
    pcVar6 = "no";
  }
  fprintf((FILE *)pAbc->Err,"\t-c       : toggle using wire-loads if specified [default = %s]\n",
          pcVar6);
  pcVar6 = "yes";
  if (local_74 == 0) {
    pcVar6 = "no";
  }
  fprintf((FILE *)pAbc->Err,"\t-v       : toggle printing verbose information [default = %s]\n",
          pcVar6);
  if (local_70 == 0) {
    pcVar7 = "no";
  }
  fprintf((FILE *)pAbc->Err,"\t-w       : toggle printing more verbose information [default = %s]\n"
          ,pcVar7);
  fwrite("\t-h       : print the command usage\n",0x24,1,(FILE *)pAbc->Err);
  return 1;
}

Assistant:

int Scl_CommandBuffer( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    SC_BusPars Pars, * pPars = &Pars;
    Abc_Ntk_t * pNtkRes, * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    memset( pPars, 0, sizeof(SC_BusPars) );
    pPars->GainRatio     =  300;
    pPars->Slew          = pAbc->pLibScl ? Abc_SclComputeAverageSlew((SC_Lib *)pAbc->pLibScl) : 100;
    pPars->nDegree       =   10;
    pPars->fSizeOnly     =    0;
    pPars->fAddBufs      =    1;
    pPars->fBufPis       =    0;
    pPars->fUseWireLoads =    0;
    pPars->fVerbose      =    0;
    pPars->fVeryVerbose  =    0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "GSNsbpcvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->GainRatio = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->GainRatio < 0 ) 
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->Slew = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->Slew < 0 ) 
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nDegree = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nDegree < 0 ) 
                goto usage;
            break;
        case 's':
            pPars->fSizeOnly ^= 1;
            break;
        case 'b':
            pPars->fAddBufs ^= 1;
            break;
        case 'p':
            pPars->fBufPis ^= 1;
            break;
        case 'c':
            pPars->fUseWireLoads ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "This command can only be applied to a logic network.\n" );
        return 1;
    }
    if ( !pPars->fSizeOnly && !pPars->fAddBufs && pNtk->vPhases == NULL )
    {
        Abc_Print( -1, "Fanin phase information is not avaiable.\n" );
        return 1;
    }
    if ( !pAbc->pLibScl || !Abc_SclHasDelayInfo(pAbc->pLibScl) )
    {
        Abc_Print( -1, "Library delay info is not available.\n" );
        return 1;
    }
    // modify the current network
    pNtkRes = Abc_SclBufferingPerform( pNtk, (SC_Lib *)pAbc->pLibScl, pPars );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "The command has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: buffer [-GSN num] [-sbpcvwh]\n" );
    fprintf( pAbc->Err, "\t           performs buffering and sizing and mapped network\n" );
    fprintf( pAbc->Err, "\t-G <num> : target gain percentage [default = %d]\n", pPars->GainRatio );
    fprintf( pAbc->Err, "\t-S <num> : target slew in pisoseconds [default = %d]\n", pPars->Slew );
    fprintf( pAbc->Err, "\t-N <num> : the maximum fanout count [default = %d]\n", pPars->nDegree );
    fprintf( pAbc->Err, "\t-s       : toggle performing only sizing [default = %s]\n", pPars->fSizeOnly? "yes": "no" );
    fprintf( pAbc->Err, "\t-b       : toggle using buffers instead of inverters [default = %s]\n", pPars->fAddBufs? "yes": "no" );
    fprintf( pAbc->Err, "\t-p       : toggle buffering primary inputs [default = %s]\n", pPars->fBufPis? "yes": "no" );
    fprintf( pAbc->Err, "\t-c       : toggle using wire-loads if specified [default = %s]\n", pPars->fUseWireLoads? "yes": "no" );
    fprintf( pAbc->Err, "\t-v       : toggle printing verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    fprintf( pAbc->Err, "\t-w       : toggle printing more verbose information [default = %s]\n", pPars->fVeryVerbose? "yes": "no" );
    fprintf( pAbc->Err, "\t-h       : print the command usage\n");
    return 1;
}